

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::TOIFactoredRewardDecPOMDPDiscrete
          (TOIFactoredRewardDecPOMDPDiscrete *this,TOIFactoredRewardDecPOMDPDiscrete *o)

{
  undefined8 *puVar1;
  string local_90;
  string local_70;
  string local_50;
  
  *(undefined8 *)&this->field_0x2d8 = 0x5d7458;
  *(undefined8 *)&this->field_0x2e0 = 0x5d76b0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"received unspec. by TOIDecPOMDPDiscrete","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"received unspec. by TOIDecPOMDPDiscrete","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"received unspec. by TOIDecPOMDPDiscrete","");
  TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
            (&this->super_TOIDecPOMDPDiscrete,&PTR_construction_vtable_96__005d61f0,&local_50,
             &local_70,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
    super_MultiAgentDecisionProcess = 0x5d5a38;
  *(undefined8 *)&this->field_0x2d8 = 0x5d5e18;
  *(undefined8 *)&this->field_0x2e0 = 0x5d6070;
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.field_0x280
       = 0x5d5c90;
  *(undefined8 *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0 = 0;
  *(undefined8 *)&this->field_0x2c8 = 0;
  *(undefined8 *)&this->field_0x2d0 = 0;
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar1 = &PTR__E_0059bd80;
  puVar1[1] = puVar1 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar1 + 1),
             "TOIFactoredRewardDecPOMDPDiscrete: copy ctor not yet implemented","");
  __cxa_throw(puVar1,&E::typeinfo,E::~E);
}

Assistant:

TOIFactoredRewardDecPOMDPDiscrete::
TOIFactoredRewardDecPOMDPDiscrete(const TOIFactoredRewardDecPOMDPDiscrete& o) 
{
    throw(E("TOIFactoredRewardDecPOMDPDiscrete: copy ctor not yet implemented"));
}